

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Prepare16(sqlite3 *db,void *zSql,int nBytes,u32 prepFlags,sqlite3_stmt **ppStmt,
                    void **pzTail)

{
  void *pvVar1;
  int iVar2;
  bool bVar3;
  int chars_parsed;
  char *z;
  int sz;
  int rc;
  char *zTail8;
  char *zSql8;
  void **pzTail_local;
  sqlite3_stmt **ppStmt_local;
  u32 prepFlags_local;
  int nBytes_local;
  void *zSql_local;
  sqlite3 *db_local;
  
  _sz = (char *)0x0;
  z._4_4_ = 0;
  *ppStmt = (sqlite3_stmt *)0x0;
  zSql8 = (char *)pzTail;
  pzTail_local = ppStmt;
  ppStmt_local._0_4_ = prepFlags;
  ppStmt_local._4_4_ = nBytes;
  _prepFlags_local = zSql;
  zSql_local = db;
  iVar2 = sqlite3SafetyCheckOk(db);
  if ((iVar2 == 0) || (_prepFlags_local == (void *)0x0)) {
    db_local._4_4_ = sqlite3MisuseError(0x21153);
  }
  else {
    if (-1 < ppStmt_local._4_4_) {
      z._0_4_ = 0;
      while( true ) {
        bVar3 = false;
        if (((int)z < ppStmt_local._4_4_) &&
           (bVar3 = true, *(char *)((long)_prepFlags_local + (long)(int)z) == '\0')) {
          bVar3 = *(char *)((long)_prepFlags_local + (long)((int)z + 1)) != '\0';
        }
        if (!bVar3) break;
        z._0_4_ = (int)z + 2;
      }
      ppStmt_local._4_4_ = (int)z;
    }
    sqlite3_mutex_enter(*(sqlite3_mutex **)((long)zSql_local + 0x18));
    zTail8 = sqlite3Utf16to8((sqlite3 *)zSql_local,_prepFlags_local,ppStmt_local._4_4_,'\x02');
    if (zTail8 != (char *)0x0) {
      z._4_4_ = sqlite3LockAndPrepare
                          ((sqlite3 *)zSql_local,zTail8,-1,(u32)ppStmt_local,(Vdbe *)0x0,
                           (sqlite3_stmt **)pzTail_local,(char **)&sz);
    }
    if ((_sz != (char *)0x0) && (zSql8 != (char *)0x0)) {
      iVar2 = sqlite3Utf8CharLen(zTail8,(int)_sz - (int)zTail8);
      pvVar1 = _prepFlags_local;
      iVar2 = sqlite3Utf16ByteLen(_prepFlags_local,iVar2);
      *(long *)zSql8 = (long)pvVar1 + (long)iVar2;
    }
    sqlite3DbFree((sqlite3 *)zSql_local,zTail8);
    iVar2 = sqlite3ApiExit((sqlite3 *)zSql_local,z._4_4_);
    sqlite3_mutex_leave(*(sqlite3_mutex **)((long)zSql_local + 0x18));
    db_local._4_4_ = iVar2;
  }
  return db_local._4_4_;
}

Assistant:

static int sqlite3Prepare16(
  sqlite3 *db,              /* Database handle. */
  const void *zSql,         /* UTF-16 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const void **pzTail       /* OUT: End of parsed string */
){
  /* This function currently works by first transforming the UTF-16
  ** encoded string to UTF-8, then invoking sqlite3_prepare(). The
  ** tricky bit is figuring out the pointer to return in *pzTail.
  */
  char *zSql8;
  const char *zTail8 = 0;
  int rc = SQLITE_OK;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppStmt==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppStmt = 0;
  if( !sqlite3SafetyCheckOk(db)||zSql==0 ){
    return SQLITE_MISUSE_BKPT;
  }
  if( nBytes>=0 ){
    int sz;
    const char *z = (const char*)zSql;
    for(sz=0; sz<nBytes && (z[sz]!=0 || z[sz+1]!=0); sz += 2){}
    nBytes = sz;
  }
  sqlite3_mutex_enter(db->mutex);
  zSql8 = sqlite3Utf16to8(db, zSql, nBytes, SQLITE_UTF16NATIVE);
  if( zSql8 ){
    rc = sqlite3LockAndPrepare(db, zSql8, -1, prepFlags, 0, ppStmt, &zTail8);
  }

  if( zTail8 && pzTail ){
    /* If sqlite3_prepare returns a tail pointer, we calculate the
    ** equivalent pointer into the UTF-16 string by counting the unicode
    ** characters between zSql8 and zTail8, and then returning a pointer
    ** the same number of characters into the UTF-16 string.
    */
    int chars_parsed = sqlite3Utf8CharLen(zSql8, (int)(zTail8-zSql8));
    *pzTail = (u8 *)zSql + sqlite3Utf16ByteLen(zSql, chars_parsed);
  }
  sqlite3DbFree(db, zSql8);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}